

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

t_template * garray_template(_garray *x)

{
  _array *p_Var1;
  t_template *local_28;
  t_template *template;
  _array *array;
  _garray *x_local;
  
  p_Var1 = garray_getarray(x);
  if (p_Var1 == (_array *)0x0) {
    local_28 = (t_template *)0x0;
  }
  else {
    local_28 = template_findbyname(p_Var1->a_templatesym);
  }
  if (local_28 == (t_template *)0x0) {
    bug("garray_template");
  }
  return local_28;
}

Assistant:

t_template *garray_template(t_garray *x)
{
    t_array *array = garray_getarray(x);
    t_template *template =
        (array ? template_findbyname(array->a_templatesym) : 0);
    if (!template)
        bug("garray_template");
    return (template);
}